

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O0

void __thiscall xray_re::xr_envelope::insert_key(xr_envelope *this,xr_key *key)

{
  float fVar1;
  value_type pxVar2;
  bool bVar3;
  size_type sVar4;
  reference ppxVar5;
  reference ppxVar6;
  const_iterator local_78;
  __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
  local_70;
  xr_key **local_68;
  xr_key **local_60;
  xr_key **local_58;
  float local_4c;
  __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
  _Stack_48;
  float time;
  xr_key_vec_it it;
  xr_key *ekey;
  xr_key *skey;
  __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
  local_28;
  const_iterator local_20;
  xr_key *local_18;
  xr_key *key_local;
  xr_envelope *this_local;
  
  local_18 = key;
  key_local = (xr_key *)this;
  bVar3 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::empty(&this->m_keys);
  if (bVar3) {
    std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::push_back
              (&this->m_keys,&local_18);
  }
  else {
    sVar4 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::size(&this->m_keys);
    if (sVar4 == 1) {
      fVar1 = local_18->time;
      ppxVar5 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::front
                          (&this->m_keys);
      if ((*ppxVar5)->time <= fVar1) {
        local_28._M_current =
             (xr_key **)
             std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::end(&this->m_keys);
      }
      else {
        local_28._M_current =
             (xr_key **)
             std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::begin
                       (&this->m_keys);
      }
      __gnu_cxx::
      __normal_iterator<xray_re::xr_key*const*,std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>>
      ::__normal_iterator<xray_re::xr_key**>
                ((__normal_iterator<xray_re::xr_key*const*,std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>>
                  *)&local_20,&local_28);
      std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::insert
                (&this->m_keys,local_20,&local_18);
    }
    else {
      ppxVar5 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::front
                          (&this->m_keys);
      pxVar2 = *ppxVar5;
      ppxVar5 = std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::back
                          (&this->m_keys);
      it._M_current = (xr_key **)*ppxVar5;
      __gnu_cxx::
      __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
      ::__normal_iterator(&stack0xffffffffffffffb8);
      local_4c = local_18->time;
      if (pxVar2->time <= local_4c) {
        if (local_4c <= *(float *)((long)it._M_current + 4)) {
          local_70._M_current =
               (xr_key **)
               std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::begin
                         (&this->m_keys);
          local_68 = (xr_key **)
                     __gnu_cxx::
                     __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                     ::operator+(&local_70,1);
          _Stack_48 = (__normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                       )local_68;
          while (ppxVar6 = __gnu_cxx::
                           __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
                           ::operator*(&stack0xffffffffffffffb8), (*ppxVar6)->time < local_4c) {
            __gnu_cxx::
            __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
            ::operator++(&stack0xffffffffffffffb8);
          }
          __gnu_cxx::
          __normal_iterator<xray_re::xr_key_**,_std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>_>
          ::operator--(&stack0xffffffffffffffb8);
        }
        else {
          local_60 = (xr_key **)
                     std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::end
                               (&this->m_keys);
          _Stack_48._M_current = local_60;
        }
      }
      else {
        local_58 = (xr_key **)
                   std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::begin
                             (&this->m_keys);
        _Stack_48._M_current = local_58;
      }
      __gnu_cxx::
      __normal_iterator<xray_re::xr_key*const*,std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>>
      ::__normal_iterator<xray_re::xr_key**>
                ((__normal_iterator<xray_re::xr_key*const*,std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>>
                  *)&local_78,&stack0xffffffffffffffb8);
      std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::insert
                (&this->m_keys,local_78,&local_18);
    }
  }
  return;
}

Assistant:

void xr_envelope::insert_key(xr_key* key)
{
	if (m_keys.empty()) {
		m_keys.push_back(key);
	} else if (m_keys.size() == 1) {
		m_keys.insert((key->time < m_keys.front()->time) ? m_keys.begin() : m_keys.end(), key);
	} else {
		xr_key* skey = m_keys.front();
		xr_key* ekey = m_keys.back();

		xr_key_vec_it it;
		float time = key->time;
		if (time < skey->time) {
			it = m_keys.begin();
		} else if (ekey->time < time) {
			it = m_keys.end();
		} else {
			for (it = m_keys.begin() + 1; (*it)->time < time; ++it) {}
			--it;
		}
		m_keys.insert(it, key);
	}
}